

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O2

MatchPattern * __thiscall
pfederc::Parser::parseMatchCase(MatchPattern *__return_storage_ptr__,Parser *this,bool *err)

{
  bool bVar1;
  Lexer *this_00;
  undefined2 local_9a;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined1 local_8c [12];
  Token *tokId;
  vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> vars;
  undefined1 local_48 [16];
  
  tokId = this->lexer->currentToken;
  bVar1 = Token::operator!=(tokId,TOK_ID);
  this_00 = this->lexer;
  if ((bVar1) && (9 < (ushort)((short)*(undefined4 *)&this_00->currentToken->type - 6U))) {
    bVar1 = Token::operator!=(this_00->currentToken,TOK_CHAR);
    this_00 = this->lexer;
    if (bVar1) {
      bVar1 = Token::operator!=(this_00->currentToken,TOK_KW_TRUE);
      this_00 = this->lexer;
      if (bVar1) {
        bVar1 = Token::operator!=(this_00->currentToken,TOK_KW_FALSE);
        this_00 = this->lexer;
        if (bVar1) {
          local_8c._4_2_ = 2;
          bodyExpr._M_t.
          super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
          super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl._0_4_ = 0x24;
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                    ((Level *)&vars,(SyntaxErrorCode *)(local_8c + 4),(Position *)&bodyExpr);
          generateError((Parser *)&stack0xffffffffffffffc8,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &stack0xffffffffffffffc8);
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)&vars);
          bVar1 = Token::operator!=(this->lexer->currentToken,TOK_OP_BRACKET_OPEN);
          if (bVar1) {
            bVar1 = Token::operator!=(this->lexer->currentToken,TOK_IMPL);
            if (bVar1) {
              Lexer::next(this->lexer);
            }
          }
          tokId = (Token *)0x0;
          goto LAB_00114391;
        }
      }
    }
  }
  Lexer::next(this_00);
LAB_00114391:
  vars.super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vars.super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vars.super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = expect(this,TOK_OP_BRACKET_OPEN);
  if (bVar1) {
    do {
      skipEol(this);
      bodyExpr._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
           this->lexer->currentToken;
      bVar1 = Token::operator!=((Token *)bodyExpr._M_t.
                                         super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                                         .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>.
                                         _M_head_impl,TOK_ID);
      if (bVar1) {
        bVar1 = Token::operator!=((Token *)bodyExpr._M_t.
                                           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                                           .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>.
                                           _M_head_impl,TOK_ANY);
        if (!bVar1) goto LAB_00114485;
        local_9a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_8c._0_4_ = STX_ERR_EXPECTED_ID_ANY;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_8c + 4),(SyntaxErrorCode *)&local_9a,(Position *)local_8c);
        generateError((Parser *)(local_48 + 8),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_48 + 8));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_8c + 4));
        bVar1 = Token::operator!=((Token *)bodyExpr._M_t.
                                           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                                           .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>.
                                           _M_head_impl,TOK_OP_COMMA);
        if (bVar1) {
          Lexer::next(this->lexer);
        }
      }
      else {
LAB_00114485:
        Lexer::next(this->lexer);
        std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::push_back
                  (&vars,(value_type *)&bodyExpr);
      }
      bVar1 = expect(this,TOK_OP_COMMA);
    } while (bVar1);
    bVar1 = expect(this,TOK_BRACKET_CLOSE);
    if (!bVar1) {
      local_8c._0_2_ = 2;
      local_8c._4_4_ = 1;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&bodyExpr,(SyntaxErrorCode *)local_8c,(Position *)(local_8c + 4));
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&bodyExpr);
    }
  }
  bVar1 = expect(this,TOK_IMPL);
  if (!bVar1) {
    local_8c._0_2_ = 2;
    local_8c._4_4_ = 0x26;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&bodyExpr,(SyntaxErrorCode *)local_8c,(Position *)(local_8c + 4));
    generateError((Parser *)&stack0xffffffffffffffb0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffb0);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&bodyExpr);
  }
  skipEol(this);
  parseFunctionBody((Parser *)&bodyExpr);
  bVar1 = expect(this,TOK_STMT);
  if (!bVar1) {
    local_9a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_8c._0_4_ = STX_ERR_EXPECTED_STMT;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_8c + 4),(SyntaxErrorCode *)&local_9a,(Position *)local_8c);
    generateError((Parser *)&stack0xffffffffffffffa8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_8c + 4));
  }
  skipEol(this);
  std::
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ::
  tuple<const_pfederc::Token_*&,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_true,_true>
            (__return_storage_ptr__,&tokId,
             (vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_> *)
             &vars.
              super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,
             &bodyExpr);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&bodyExpr);
  std::_Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>::~_Vector_base
            (&vars.
              super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>);
  return __return_storage_ptr__;
}

Assistant:

MatchPattern Parser::parseMatchCase(bool &err) noexcept {
  const Token *tokId = lexer.getCurrentToken();
  if (*lexer.getCurrentToken() != TokenType::TOK_ID
      && !isNumberType(lexer.getCurrentToken()->getType())
      && *lexer.getCurrentToken() != TokenType::TOK_CHAR
      && *lexer.getCurrentToken() != TokenType::TOK_KW_TRUE
      && *lexer.getCurrentToken() != TokenType::TOK_KW_FALSE) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID_NUM_CHAR_BOOL,
          lexer.getCurrentToken()->getPosition()));
    if (*lexer.getCurrentToken()  != TokenType::TOK_OP_BRACKET_OPEN
        && *lexer.getCurrentToken() != TokenType::TOK_IMPL)
      lexer.next(); // skip
    tokId = nullptr;
  } else {
    lexer.next();
  }

  std::vector<const Token *> vars;
  if (expect(TokenType::TOK_OP_BRACKET_OPEN)) {
    do {
      skipEol();
      const Token *const tokVarId = lexer.getCurrentToken();
      if (*tokVarId != TokenType::TOK_ID && *tokVarId != TokenType::TOK_ANY) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_EXPECTED_ID_ANY,
              lexer.getCurrentToken()->getPosition()));
        if (*tokVarId != TokenType::TOK_OP_COMMA)
          lexer.next();
      } else {
        lexer.next(); // eat id|any

        vars.push_back(tokVarId);
      }
    } while (expect(TokenType::TOK_OP_COMMA));

    if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
            lexer.getCurrentToken()->getPosition()));
    }
  }

  if (!expect(TokenType::TOK_IMPL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_OP_IMPL,
            lexer.getCurrentToken()->getPosition()));
  }

  skipEol();

  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
            lexer.getCurrentToken()->getPosition()));
  }

  skipEol();

  return MatchPattern(tokId, std::move(vars), std::move(bodyExpr));
}